

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pcache1Shrink(sqlite3_pcache *p)

{
  long lVar1;
  long *in_RDI;
  int savedMaxPage;
  PGroup *pGroup;
  PCache1 *pCache;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar2;
  
  if ((int)in_RDI[2] != 0) {
    lVar1 = *in_RDI;
    sqlite3_mutex_enter((sqlite3_mutex *)0x1b09a8);
    uVar2 = *(undefined4 *)(lVar1 + 8);
    *(undefined4 *)(lVar1 + 8) = 0;
    pcache1EnforceMaxPage((PGroup *)CONCAT44(uVar2,in_stack_ffffffffffffffe0));
    *(undefined4 *)(lVar1 + 8) = uVar2;
    sqlite3_mutex_leave((sqlite3_mutex *)0x1b09e3);
  }
  return;
}

Assistant:

static void pcache1Shrink(sqlite3_pcache *p){
  PCache1 *pCache = (PCache1*)p;
  if( pCache->bPurgeable ){
    PGroup *pGroup = pCache->pGroup;
    int savedMaxPage;
    pcache1EnterMutex(pGroup);
    savedMaxPage = pGroup->nMaxPage;
    pGroup->nMaxPage = 0;
    pcache1EnforceMaxPage(pGroup);
    pGroup->nMaxPage = savedMaxPage;
    pcache1LeaveMutex(pGroup);
  }
}